

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O2

void printTessCacheStats(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\"SHARED TESSELLATION CACHE\"");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,"SHARED TESSELLATION CACHE");
  std::endl<char,std::char_traits<char>>(poVar1);
  embree::SharedTessellationCacheStats::printStats();
  LOCK();
  embree::SharedTessellationCacheStats::cache_accesses = 0;
  UNLOCK();
  LOCK();
  embree::SharedTessellationCacheStats::cache_hits = 0;
  UNLOCK();
  LOCK();
  embree::SharedTessellationCacheStats::cache_misses = 0;
  UNLOCK();
  LOCK();
  embree::SharedTessellationCacheStats::cache_flushes = 0;
  UNLOCK();
  return;
}

Assistant:

void printTessCacheStats()
{
  PRINT("SHARED TESSELLATION CACHE");
  embree::SharedTessellationCacheStats::printStats();
  embree::SharedTessellationCacheStats::clearStats();
}